

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O2

int __thiscall
ncnn::ExpandDims::forward(ExpandDims *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int _h;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  Mat local_78;
  
  iVar3 = bottom_blob->dims;
  pvVar2 = (this->axes).data;
  if ((pvVar2 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    bVar8 = this->expand_w != 0;
    bVar9 = this->expand_h != 0;
    bVar10 = this->expand_c != 0;
  }
  else {
    uVar1 = (this->axes).w;
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    bVar8 = false;
    bVar9 = false;
    bVar10 = false;
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      bVar7 = iVar3 == 2;
      iVar6 = *(int *)((long)pvVar2 + uVar5 * 4);
      iVar6 = (iVar6 >> 0x1f & iVar3 + 1U) + iVar6;
      bVar10 = (bool)(bVar10 | (iVar6 == 0 && bVar7));
      bVar9 = (bool)(bVar9 | (iVar6 == 1 && bVar7 || iVar3 == 1 && iVar6 == 0));
      bVar8 = (bool)(bVar8 | (iVar6 == 2 && bVar7 || iVar3 == 1 && iVar6 == 1));
    }
  }
  iVar6 = bottom_blob->w;
  _h = bottom_blob->h;
  Mat::operator=(top_blob,bottom_blob);
  if (iVar3 == 2) {
    if (bVar8) {
      Mat::reshape(&local_78,bottom_blob,1,iVar6,_h,opt->blob_allocator);
      Mat::operator=(top_blob,&local_78);
    }
    else if (bVar9) {
      Mat::reshape(&local_78,bottom_blob,iVar6,1,_h,opt->blob_allocator);
      Mat::operator=(top_blob,&local_78);
    }
    else {
      if (!bVar10) goto LAB_0026ac7a;
      Mat::reshape(&local_78,bottom_blob,iVar6,_h,1,opt->blob_allocator);
      Mat::operator=(top_blob,&local_78);
    }
  }
  else {
    if (iVar3 != 1) goto LAB_0026ac7a;
    if ((bool)(bVar8 & bVar9)) {
      Mat::reshape(&local_78,bottom_blob,1,iVar6,1,opt->blob_allocator);
      Mat::operator=(top_blob,&local_78);
    }
    else if (bVar8) {
      Mat::reshape(&local_78,bottom_blob,1,iVar6,opt->blob_allocator);
      Mat::operator=(top_blob,&local_78);
    }
    else {
      if (!bVar9) goto LAB_0026ac7a;
      Mat::reshape(&local_78,bottom_blob,iVar6,1,opt->blob_allocator);
      Mat::operator=(top_blob,&local_78);
    }
  }
  Mat::~Mat(&local_78);
LAB_0026ac7a:
  if ((top_blob->data == (void *)0x0) || (iVar3 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar3 = -100;
  }
  return iVar3;
}

Assistant:

int ExpandDims::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int dims = bottom_blob.dims;

    bool _expand_w = false;
    bool _expand_h = false;
    bool _expand_c = false;

    if (axes.empty())
    {
        _expand_w = expand_w;
        _expand_h = expand_h;
        _expand_c = expand_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;

            if (dims == 1 && axis == 0)
            {
                _expand_h = true;
            }
            if (dims == 1 && axis == 1)
            {
                _expand_w = true;
            }
            if (dims == 2 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 2 && axis == 1)
            {
                _expand_h = true;
            }
            if (dims == 2 && axis == 2)
            {
                _expand_w = true;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_expand_w && _expand_h)
        {
            top_blob = bottom_blob.reshape(1, w, 1, opt.blob_allocator);
        }
        else if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, 1, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}